

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Kss_Emu::run_clocks(Kss_Emu *this,blip_time_t *duration,int param_2)

{
  blip_time_t *pbVar1;
  uint16_t uVar2;
  state_t *psVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  
  psVar3 = (this->super_Kss_Cpu).state;
  iVar6 = psVar3->base + psVar3->time;
  iVar5 = *duration;
  if (iVar6 < iVar5) {
    do {
      iVar6 = this->next_play;
      if (iVar5 < this->next_play) {
        iVar6 = iVar5;
      }
      Kss_Cpu::run(&this->super_Kss_Cpu,iVar6);
      uVar2 = (this->super_Kss_Cpu).r.pc;
      if (uVar2 == 0xffff) {
        psVar3 = (this->super_Kss_Cpu).state;
        psVar3->time = iVar6 - psVar3->base;
      }
      psVar3 = (this->super_Kss_Cpu).state;
      if ((this->next_play <= psVar3->base + psVar3->time) &&
         (this->next_play = this->next_play + this->play_period, uVar2 == 0xffff)) {
        if ((this->gain_updated == false) && (this->gain_updated = true, this->scc_accessed == true)
           ) {
          update_gain(this);
        }
        uVar2 = (this->super_Kss_Cpu).r.sp;
        uVar4 = uVar2 - 1;
        (this->super_Kss_Cpu).r.sp = uVar4;
        this->ram[uVar4] = 0xff;
        uVar4 = uVar2 - 2;
        (this->super_Kss_Cpu).r.sp = uVar4;
        this->ram[uVar4] = 0xff;
        (this->super_Kss_Cpu).r.pc = *(uint16_t *)(this->header_).super_header_t.play_addr;
      }
      psVar3 = (this->super_Kss_Cpu).state;
      iVar6 = psVar3->base + psVar3->time;
      iVar5 = *duration;
    } while (iVar6 < iVar5);
  }
  *duration = iVar6;
  this->next_play = this->next_play - iVar6;
  psVar3->time = psVar3->time - *duration;
  iVar5 = *duration;
  if ((this->ay).last_time < iVar5) {
    Ay_Apu::run_until(&this->ay,iVar5);
  }
  pbVar1 = &(this->ay).last_time;
  *pbVar1 = *pbVar1 - iVar5;
  iVar5 = *duration;
  if ((this->scc).last_time < iVar5) {
    Scc_Apu::run_until(&this->scc,iVar5);
  }
  pbVar1 = &(this->scc).last_time;
  *pbVar1 = *pbVar1 - iVar5;
  if (this->sn != (Sms_Apu *)0x0) {
    Sms_Apu::end_frame(this->sn,*duration);
  }
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Kss_Emu::run_clocks( blip_time_t& duration, int )
{
	while ( time() < duration )
	{
		blip_time_t end = min( duration, next_play );
		cpu::run( min( duration, next_play ) );
		if ( r.pc == idle_addr )
			set_time( end );
		
		if ( time() >= next_play )
		{
			next_play += play_period;
			if ( r.pc == idle_addr )
			{
				if ( !gain_updated )
				{
					gain_updated = true;
					if ( scc_accessed )
						update_gain();
				}
				
				ram [--r.sp] = idle_addr >> 8;
				ram [--r.sp] = idle_addr & 0xFF;
				r.pc = get_le16( header_.play_addr );
				GME_FRAME_HOOK( this );
			}
		}
	}
	
	duration = time();
	next_play -= duration;
	check( next_play >= 0 );
	adjust_time( -duration );
	ay.end_frame( duration );
	scc.end_frame( duration );
	if ( sn )
		sn->end_frame( duration );
	
	return 0;
}